

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditorImage::LoadAutoMapper(CEditorImage *this)

{
  long lVar1;
  IStorage *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  char *pcVar5;
  json_value *this_00;
  _json_value *p_Var6;
  CDoodadsMapper *this_01;
  _func_int **pp_Var7;
  undefined8 uVar8;
  IConsole *pIVar9;
  char *pcVar10;
  uint size;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [512];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pAutoMapper != (IAutoMapper *)0x0) goto LAB_00185720;
  str_format(aBuf,0x200,"editor/automap/%s.json",this->m_aName);
  pIVar2 = this->m_pEditor->m_pStorage;
  iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])
                    (pIVar2,aBuf,1,0xffffffffffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar3);
  if (io == (IOHANDLE)0x0) goto LAB_00185720;
  lVar4 = io_length(io);
  size = (uint)lVar4;
  pcVar5 = (char *)mem_alloc(size);
  io_read(io,pcVar5,size);
  io_close(io);
  mem_zero(&JsonSettings,0x30);
  this_00 = json_parse_ex(&JsonSettings,pcVar5,(long)(int)size,aError);
  mem_free(pcVar5);
  if (this_00 == (json_value *)0x0) {
    pIVar9 = this->m_pEditor->m_pConsole;
    pp_Var7 = (pIVar9->super_IInterface)._vptr_IInterface;
    uVar8 = 1;
    pcVar10 = aBuf;
    pcVar5 = aError;
  }
  else {
    p_Var6 = _json_value::operator[](this_00,"tileset");
    if (p_Var6->type == json_array) {
      this_01 = (CDoodadsMapper *)operator_new(0x28);
      CTilesetMapper::CTilesetMapper((CTilesetMapper *)this_01,this->m_pEditor);
LAB_0018587f:
      this->m_pAutoMapper = &this_01->super_IAutoMapper;
      (*(this_01->super_IAutoMapper)._vptr_IAutoMapper[2])(this_01,p_Var6);
    }
    else {
      p_Var6 = _json_value::operator[](this_00,"doodads");
      if (p_Var6->type == json_array) {
        this_01 = (CDoodadsMapper *)operator_new(0x68);
        CDoodadsMapper::CDoodadsMapper(this_01,this->m_pEditor);
        goto LAB_0018587f;
      }
    }
    json_value_free(this_00);
    if ((this->m_pAutoMapper == (IAutoMapper *)0x0) || (this->m_pEditor->m_pConfig->m_Debug == 0))
    goto LAB_00185720;
    iVar3 = this->m_pAutoMapper->m_Type;
    pcVar10 = "";
    if (iVar3 == 1) {
      pcVar10 = "doodads";
    }
    if (iVar3 == 0) {
      pcVar10 = "tileset";
    }
    pcVar5 = aBuf;
    str_format(pcVar5,0x200,"loaded %s.json (%s)",this->m_aName,pcVar10);
    pIVar9 = this->m_pEditor->m_pConsole;
    pp_Var7 = (pIVar9->super_IInterface)._vptr_IInterface;
    pcVar10 = "editor";
    uVar8 = 2;
  }
  (*pp_Var7[0x19])(pIVar9,uVar8,pcVar10,pcVar5,0);
LAB_00185720:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditorImage::LoadAutoMapper()
{
	if(m_pAutoMapper)
		return;

	// read file data into buffer
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "editor/automap/%s.json", m_aName);
	IOHANDLE File = m_pEditor->Storage()->OpenFile(aBuf, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, aBuf, aError);
		return;
	}

	// generate configurations
	const json_value &rTileset = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_TILESET)];
	if(rTileset.type == json_array)
	{
		m_pAutoMapper = new CTilesetMapper(m_pEditor);
		m_pAutoMapper->Load(rTileset);
	}
	else
	{
		const json_value &rDoodads = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_DOODADS)];
		if(rDoodads.type == json_array)
		{
			m_pAutoMapper = new CDoodadsMapper(m_pEditor);
			m_pAutoMapper->Load(rDoodads);
		}
	}

	// clean up
	json_value_free(pJsonData);
	if(m_pAutoMapper && m_pEditor->Config()->m_Debug)
	{
		str_format(aBuf, sizeof(aBuf),"loaded %s.json (%s)", m_aName, IAutoMapper::GetTypeName(m_pAutoMapper->GetType()));
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "editor", aBuf);
	}
}